

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O0

int __thiscall
FormatTypeSCP::SaveDisk
          (FormatTypeSCP *this,char *file_path,IDisk *disk,ILoadingProgress *loading_progress)

{
  uint uVar1;
  long lVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uchar *buff;
  bool bVar7;
  uint local_360;
  int local_35c;
  int local_358;
  int crc;
  uint adujst;
  double total_aimed;
  double current;
  double ratio;
  int local_330;
  uint index_on_track;
  uint total_flux;
  unsigned_short flux;
  int length;
  uint index_time;
  int offset_track;
  int clock;
  int tracklength;
  int dskTrack;
  int side;
  uchar track;
  int res;
  int nbSideToRecord;
  uchar *pTrackBuffer;
  uchar buffer [680];
  uint local_44;
  FILE *pFStack_40;
  int offset;
  FILE *file;
  undefined4 local_30;
  int i;
  int ret;
  uint checksum;
  ILoadingProgress *loading_progress_local;
  IDisk *disk_local;
  char *file_path_local;
  FormatTypeSCP *this_local;
  
  i = 0;
  local_30 = 0;
  _ret = loading_progress;
  loading_progress_local = (ILoadingProgress *)disk;
  disk_local = (IDisk *)file_path;
  file_path_local = (char *)this;
  memset(&pTrackBuffer,0,0x2a8);
  if (*(int *)(loading_progress_local + 0x30) == 0) {
    local_35c = *(int *)(loading_progress_local + 0x20) << 1;
  }
  else {
    local_35c = *(int *)(loading_progress_local + 0x20) + *(int *)(loading_progress_local + 0x30);
  }
  iVar4 = IDisk::SmartOpen((IDisk *)loading_progress_local,(FILE **)&stack0xffffffffffffffc0,
                           (char *)disk_local,".SCP");
  if (iVar4 == 0) {
    pTrackBuffer._0_2_ = 0x4353;
    pTrackBuffer._2_1_ = 0x50;
    pTrackBuffer._3_1_ = 0x11;
    pTrackBuffer._4_1_ = 0;
    pTrackBuffer._5_1_ = 1;
    pTrackBuffer._6_1_ = 0;
    pTrackBuffer._7_1_ = (char)local_35c + -1;
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\x02';
    local_44 = 0x2a8;
    i = 0;
    fwrite(&pTrackBuffer,0x2a8,1,pFStack_40);
    for (dskTrack._3_1_ = 0; (int)(uint)dskTrack._3_1_ < local_35c;
        dskTrack._3_1_ = dskTrack._3_1_ + 1) {
      if ((*(int *)(loading_progress_local + 0x30) == 0) ||
         (loading_progress_local[8] == (ILoadingProgress)0x1)) {
        local_360 = 0;
      }
      else {
        local_360 = (uint)dskTrack._3_1_ % 2;
      }
      iVar4 = (int)(uint)dskTrack._3_1_ >> 1;
      uVar1 = *(uint *)(*(long *)(loading_progress_local + (long)(int)local_360 * 0x10 + 0x18) +
                        (long)iVar4 * 0x20 + 0x18);
      lVar2 = 200000000 / (long)(int)(uVar1 * 0x19);
      iVar5 = (int)lVar2;
      AddIntToBuffer((uchar *)&pTrackBuffer,(uint)dskTrack._3_1_ * 4 + 0x10,local_44);
      buff = (uchar *)operator_new__((long)(int)(uVar1 * 2 + 0x40));
      buff[0] = 'T';
      buff[1] = 'R';
      buff[2] = 'K';
      buff[3] = dskTrack._3_1_;
      AddIntToBuffer(buff,4,8000000);
      AddIntToBuffer(buff,0xc,0x10);
      length = 0x10;
      total_flux = 0;
      file._4_4_ = 0;
      sVar3 = (short)lVar2;
      ratio._4_4_ = 1;
      while( true ) {
        bVar7 = false;
        if ((ratio._4_4_ < uVar1) &&
           (bVar7 = false,
           *(char *)(*(long *)(*(long *)(loading_progress_local + (long)(int)local_360 * 0x10 + 0x18
                                        ) + (long)iVar4 * 0x20 + 0x10) + (ulong)(ratio._4_4_ - 1))
           != '\x01')) {
          bVar7 = *(char *)(*(long *)(*(long *)(loading_progress_local +
                                               (long)(int)local_360 * 0x10 + 0x18) +
                                      (long)iVar4 * 0x20 + 0x10) + (ulong)ratio._4_4_) != '\0';
        }
        local_330 = iVar5;
        if (!bVar7) break;
        ratio._4_4_ = ratio._4_4_ + 1;
      }
      for (; index_on_track._2_2_ = sVar3, file._4_4_ < (int)uVar1; file._4_4_ = file._4_4_ + 1) {
        while( true ) {
          bVar7 = false;
          if (file._4_4_ < (int)uVar1) {
            bVar7 = (*(byte *)(*(long *)(*(long *)(loading_progress_local +
                                                  (long)(int)local_360 * 0x10 + 0x18) +
                                         (long)iVar4 * 0x20 + 0x10) +
                              (ulong)(file._4_4_ + ratio._4_4_) % (ulong)uVar1) & 1) == 0;
          }
          if (!bVar7) break;
          local_330 = iVar5 + local_330;
          file._4_4_ = file._4_4_ + 1;
          index_on_track._2_2_ = index_on_track._2_2_ + sVar3;
        }
        iVar6 = (int)(long)((200000000.0 / ((double)(int)uVar1 * 25.0)) * ((double)file._4_4_ + 1.0)
                           ) - local_330;
        AddShortToBuffer(buff,length,index_on_track._2_2_ + (short)iVar6);
        length = length + 2;
        total_flux = total_flux + 1;
        local_330 = iVar5 + iVar6 + local_330;
      }
      local_44 = length + local_44;
      AddIntToBuffer(buff,8,total_flux);
      for (local_358 = 0; local_358 < length; local_358 = local_358 + 1) {
        i = (uint)buff[local_358] + i;
      }
      fwrite(buff,(long)length,1,pFStack_40);
      if (buff != (uchar *)0x0) {
        operator_delete__(buff);
      }
    }
    for (file._4_4_ = 0x10; file._4_4_ < 0x2a8; file._4_4_ = file._4_4_ + 1) {
      i = (uint)buffer[(long)file._4_4_ + -8] + i;
    }
    buffer[4] = (undefined1)i;
    buffer[5] = i._1_1_;
    buffer[6] = i._2_1_;
    buffer[7] = i._3_1_;
    fseek(pFStack_40,0,0);
    fwrite(&pTrackBuffer,0x2a8,1,pFStack_40);
    loading_progress_local[0x3c] = (ILoadingProgress)0x0;
    fclose(pFStack_40);
  }
  return 0;
}

Assistant:

int FormatTypeSCP::SaveDisk(const char* file_path, IDisk* disk, ILoadingProgress* loading_progress) const
{
   unsigned int checksum = 0;
   int ret = 0;
   int i;
   FILE* file;
   int offset = 0;
   unsigned char buffer[0x2A8] = {0};

   unsigned char* pTrackBuffer; // = new unsigned char[m_Disk[0].NbTracks + m_Disk[1].NbTracks];
   //int*pTrackBufferSize = new int [m_Disk[0].NbTracks + m_Disk[1].NbTracks];

   int nbSideToRecord = (disk->side_[1].nb_tracks == 0)
                           ? disk->side_[0].nb_tracks * 2
                           : disk->side_[0].nb_tracks + disk->side_[1].nb_tracks;

   int res = disk->SmartOpen(&file, file_path, ".SCP");

   if (res == 0)
   {
      // First part
      memcpy(&buffer[offset], "SCP", 3);
      offset += 3;
      buffer[offset++] = 0x11;
      buffer[offset++] = 0x00;
      buffer[offset++] = 0x01; // One revolution only
      buffer[offset++] = 0x00; // Start track
      buffer[offset++] = nbSideToRecord - 1; // End track
      buffer[offset++] = 0x00; // Flags bits
      buffer[offset++] = 0x00; // Bit cell encoding
      buffer[offset++] = 0x02; // Two side...

      offset += 1; // Reserved

      // checksum is added later
      offset = 0x2A8;
      // Tracks
      // CHEAT : If no 2nd side is recorded, just record twice the first one....


      checksum = 0;

      // Write begining...
      fwrite(buffer, 0x2A8, 1, file);

      for (unsigned char track = 0; track < nbSideToRecord; track++)
      {
         int side = (disk->side_[1].nb_tracks == 0 || disk->nb_sides_ == 1 ) ? 0 : track % 2;

         int dskTrack = /*(m_Disk[1].NbTracks==0)?track:*/track >> 1;

         int tracklength = disk->side_[side].tracks[dskTrack]/*.Revolution[0]*/.size;

         // Taille de la clock :
         // Pour un bitcell a 2us :
         // int clock = 2000 / 25; // 2 us
         // Pour un bitcell a 200ms / tracklength
         int clock = 200000000 /(25* tracklength);


         // Set the offset
         int offset_track = 0;

         // Add to header buffer
         AddIntToBuffer(buffer, 0x10 + track * sizeof(int), offset);

         // Compute max length of the buffer
         // Allocate max possible buffer
         pTrackBuffer/*[track]*/ = new unsigned char[tracklength * 2 + 0x40];
         // Max is transition every cells : 16 bits / transitions

         // Header
         memcpy(&pTrackBuffer/*[track]*/[offset_track], "TRK", 3);
         offset_track += 3;
         pTrackBuffer/*[track]*/[offset_track++] = track; // (track<<1)|track%2;

         // INDEX TIME = 32 BIT VALUE, TIME IN NANOSECONDS/25ns FOR ONE REVOLUTION
         unsigned int index_time = tracklength * clock;
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x04, 0x7A1200); // 200 ms for one revolution - TODO : TO ADJUST ?

         // Offset of revolution
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x0C, 0x10);

         offset_track = 0x10;
         // TRACK DATA = 16 BIT VALUE, TIME IN NANOSECONDS/25ns FOR ONE BIT CELL TIME
         int length = 0;
         //
         i = 0;

         // First bit : Depends on the last bit of the track
         // In fact, it it necessary to adjust to last '0' (or first '0' ) of the track, close to the index

         // If zero, dont begin with
         unsigned short flux = clock;
         unsigned int total_flux = clock;

         unsigned int index_on_track = 1;
         // Search for nearest '10'
         while (index_on_track < tracklength && disk->side_[side].tracks[dskTrack].bitfield[index_on_track-1] != 1 && disk->side_[side].tracks[dskTrack].bitfield[index_on_track ] != 0)
         {
            index_on_track++;
         }

         // HACK for "Reussir"
         /*
         if (track == 38)
         {
            index_on_track = 34950;
         }*/
         
         while (i < tracklength)
         {
            // Wait for next flux reversal
            // Handle weak bits (todo)

            while (i < tracklength && (disk->side_[side].tracks[dskTrack].bitfield[(i+index_on_track)%tracklength]&0x1) == 0x00)
            {
               // Overflow handling ?
               if ((int)(flux + clock) >= 0x10000)
               {
                  // Overflow handling TODO
               }

               flux += clock;
               total_flux += clock;
               ++i;
            }

            // Adjust bitcell to reach 200ms track
            double ratio = (double)i / (double)tracklength;
            double current = clock * (i+1);
            double total_aimed = 200000000.0 / (25.0 * (double)tracklength) * (double)(i+1.0);

            unsigned int adujst = (unsigned int)total_aimed - total_flux;
            total_flux += adujst; // NON
            flux += adujst; // NON

            // New one : Write it, and begin a new sequence
            AddShortToBuffer(pTrackBuffer/*[track]*/, offset_track, flux);
            //checksum += flux;

            offset_track += 2;
            length++;
            ++i;
            flux = clock;
            total_flux += clock;
         }
         // Last offset
         /*AddShortToBuffer ( pTrackBuffer[track], offsetTrack , flux );
         offsetTrack += 2;
         length++;*/

         //
         //pTrackBufferSize[track] = offsetTrack;
         // Track length
         offset += offset_track;
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x08, length); // 200 ms for one revolution - TODO : TO ADJUST ?

         for (int crc = 0; crc < offset_track; crc++)
         {
            checksum += pTrackBuffer[crc];
         }

         fwrite(pTrackBuffer, offset_track, 1, file);
         delete[]pTrackBuffer;
      }

      // Timestamp


      // --- Checksum : Compute it
      // Header
      for (i = 0x10; i < 0x2A8; i++) checksum += buffer[i];
      // Write it
      // Timestamp
      // TODO

      // Write it
      memcpy(&buffer[0x0C], (unsigned int*)&checksum, 4);
      /*buffer[0x0C] =  (checksum & 0xFF);
      buffer[0x0D] =  ((checksum>>1) & 0xFF);
      buffer[0x0E] =  ((checksum>>2) & 0xFF);
      buffer[0x0F] =  ((checksum>>3) & 0xFF);*/

      // --- Write buffers
      // Go back to begining of file
      fseek(file, 0, SEEK_SET);
      fwrite(buffer, 0x2A8, 1, file);

      /*// Track buffers
      for (int track = 0; track < m_Disk[0].NbTracks + m_Disk[1].NbTracks; track ++)
      {
      fwrite ( pTrackBuffer[track],  pTrackBufferSize[track], 1, file) ;
      }

      */

      disk->disk_modified_ = false;
      fclose(file);
   }

   //delete []pTrackBufferSize;

   /*for (unsigned char track = 0; track < m_Disk[0].NbTracks + m_Disk[1].NbTracks; track ++)
   delete (pTrackBuffer[track]);
   delete []pTrackBuffer;*/

   return 0;
}